

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPolygonOffsetTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_0::UsageTestCase::testPolygonOffset(UsageTestCase *this)

{
  TextureFormat log;
  RenderContext *pRVar1;
  TestContext *testCtx;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 extraout_var;
  TestError *this_00;
  Renderer referenceRenderer;
  Surface referenceImage;
  Surface testImage;
  Program local_580;
  undefined1 local_568 [24];
  anon_union_16_3_1194ccdc_for_v aStack_550;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  MultisamplePixelBufferAccess local_4e0;
  DrawCommand local_4b8;
  undefined1 local_488 [8];
  int local_480;
  int local_47c;
  pointer local_478;
  MultisamplePixelBufferAccess local_308;
  MultisamplePixelBufferAccess local_2e0;
  PixelBufferAccess local_2b8;
  ShaderProgram program;
  PrimitiveList local_138;
  RenderState state;
  long lVar5;
  
  local_518 = 0x3f800000bf800000;
  uStack_510 = 0x3f80000000000000;
  local_508 = 0x3f8000003f800000;
  uStack_500 = 0x3f80000000000000;
  local_4f8 = 0xbf8000003f800000;
  uStack_4f0 = 0x3f80000000000000;
  log = (TextureFormat)
        ((this->super_PolygonOffsetTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
        ->m_log;
  iVar2 = (this->super_PolygonOffsetTestCase).m_targetSize;
  tcu::Surface::Surface(&testImage,iVar2,iVar2);
  iVar2 = (this->super_PolygonOffsetTestCase).m_targetSize;
  tcu::Surface::Surface(&referenceImage,iVar2,iVar2);
  iVar2 = (*((this->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  pRVar1 = ((this->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&state,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec4 a_color;\nout highp vec4 v_color;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_color = a_color;\n}\n"
             ,(allocator<char> *)&local_4b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_568,
             "#version 300 es\nin highp vec4 v_color;\nlayout(location = 0) out mediump vec4 fragColor;void main (void)\n{\n\tfragColor = v_color;\n}\n"
             ,(allocator<char> *)&local_4e0);
  glu::makeVtxFragSources((ProgramSources *)local_488,(string *)&state,(string *)local_568);
  glu::ShaderProgram::ShaderProgram(&program,pRVar1,(ProgramSources *)local_488);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_488);
  std::__cxx11::string::~string((string *)local_568);
  std::__cxx11::string::~string((string *)&state);
  uVar3 = (**(code **)(lVar5 + 0x780))(program.m_program.m_program,"a_position");
  uVar4 = (**(code **)(lVar5 + 0x780))(program.m_program.m_program,"a_color");
  if (program.m_program.m_info.linkOk != false) {
    (**(code **)(lVar5 + 0x1c0))(0,0,0,0x3f800000);
    (**(code **)(lVar5 + 0x1d0))(0x3f800000);
    (**(code **)(lVar5 + 0x188))(0x4100);
    (**(code **)(lVar5 + 0x1a00))(0,0,(this->super_PolygonOffsetTestCase).m_targetSize);
    (**(code **)(lVar5 + 0x1680))(program.m_program.m_program);
    (**(code **)(lVar5 + 0x5e0))(0xb71);
    (**(code **)(lVar5 + 0x4a0))(0x203);
    local_488 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_480);
    std::operator<<((ostream *)&local_480,"DepthFunc = GL_LEQUAL");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_488,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_480);
    (**(code **)(lVar5 + 0x610))(uVar3);
    (**(code **)(lVar5 + 0x19f0))(uVar3,4,0x1406,0,0,&local_518);
    local_488 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_480);
    std::operator<<((ostream *)&local_480,
                    "Draw bottom-right. Color = White.\tState: PolygonOffset(0, -2), POLYGON_OFFSET_FILL disabled."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_488,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_480);
    (**(code **)(lVar5 + 0x1028))(0,0xc0000000);
    (**(code **)(lVar5 + 0x4e8))(0x8037);
    (**(code **)(lVar5 + 0x1858))(0x3f800000,0x3f800000,0x3f800000,0x3f800000,uVar4);
    (**(code **)(lVar5 + 0x538))(4,0,3);
    local_488 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_480);
    std::operator<<((ostream *)&local_480,
                    "Draw bottom-right. Color = Red.\tState: PolygonOffset(0, -1), POLYGON_OFFSET_FILL enabled."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_488,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_480);
    (**(code **)(lVar5 + 0x1028))(0,0xbf800000);
    (**(code **)(lVar5 + 0x5e0))(0x8037);
    (**(code **)(lVar5 + 0x1858))(0x3f800000,0,0,0x3f800000,uVar4);
    (**(code **)(lVar5 + 0x538))(4,0,3);
    (**(code **)(lVar5 + 0x518))(uVar3);
    (**(code **)(lVar5 + 0x1680))(0);
    (**(code **)(lVar5 + 0x648))();
    pRVar1 = ((this->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)local_488,&testImage);
    glu::readPixels(pRVar1,0,0,(PixelBufferAccess *)local_488);
    glu::ShaderProgram::~ShaderProgram(&program);
    rr::Renderer::Renderer(&referenceRenderer);
    local_538 = 0;
    uStack_530 = 0;
    aStack_550._8_8_ = 0;
    uStack_540 = 0;
    local_568._16_8_ = 0;
    aStack_550._0_8_ = 0;
    local_480 = (this->super_PolygonOffsetTestCase).m_targetSize;
    local_488._0_4_ = R;
    local_488._4_4_ = SNORM_INT8;
    local_478 = (pointer)0x3f80000000000000;
    local_47c = local_480;
    rr::RenderState::RenderState(&state,(ViewportState *)local_488,VIEWPORTORIENTATION_LOWER_LEFT);
    PositionColorShader::PositionColorShader((PositionColorShader *)&program);
    local_568._0_8_ = (pointer)0x400000000;
    local_568._8_8_ = 0;
    local_568._16_8_ = &local_518;
    uStack_540 = CONCAT44(uStack_540._4_4_,0x22);
    local_528 = 0x3f800000;
    uStack_520 = 0x3f80000000000000;
    tcu::Surface::getAccess((PixelBufferAccess *)local_488,&referenceImage);
    local_4b8.state = (RenderState *)0x0;
    local_4b8.renderTarget = (RenderTarget *)0x3f80000000000000;
    tcu::clear((PixelBufferAccess *)local_488,(Vec4 *)&local_4b8);
    local_488 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_480);
    std::operator<<((ostream *)&local_480,"Expecting: Bottom-right = Red.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_488,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_480);
    tcu::Surface::getAccess(&local_2b8,&referenceImage);
    rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(&local_4e0,&local_2b8);
    rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess(&local_2e0);
    rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess(&local_308);
    rr::RenderTarget::RenderTarget((RenderTarget *)local_488,&local_4e0,&local_2e0,&local_308);
    local_580.fragmentShader =
         (FragmentShader *)
         &program.m_shaders[5].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_580.geometryShader = (GeometryShader *)0x0;
    local_580.vertexShader = (VertexShader *)&program;
    rr::PrimitiveList::PrimitiveList(&local_138,PRIMITIVETYPE_TRIANGLES,3,0);
    local_4b8.program = &local_580;
    local_4b8.numVertexAttribs = 2;
    local_4b8.vertexAttribs = (VertexAttrib *)local_568;
    local_4b8.state = &state;
    local_4b8.renderTarget = (RenderTarget *)local_488;
    local_4b8.primitives = &local_138;
    rr::Renderer::draw(&referenceRenderer,&local_4b8);
    sglr::ShaderProgram::~ShaderProgram((ShaderProgram *)&program);
    rr::Renderer::~Renderer(&referenceRenderer);
    testCtx = (this->super_PolygonOffsetTestCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx;
    pRVar1 = ((this->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)local_488,&testImage);
    tcu::Surface::getAccess((PixelBufferAccess *)&program,&referenceImage);
    verifyImages((TestLog *)log,testCtx,pRVar1,(ConstPixelBufferAccess *)local_488,
                 (ConstPixelBufferAccess *)&program);
    tcu::Surface::~Surface(&referenceImage);
    tcu::Surface::~Surface(&testImage);
    return;
  }
  glu::operator<<((TestLog *)log,&program);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Shader compile failed.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPolygonOffsetTests.cpp"
             ,0x17a);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void UsageTestCase::testPolygonOffset (void)
{
	using tcu::TestLog;

	const tcu::Vec4 triangle[] =
	{
		tcu::Vec4(-1,  1,  0,  1),
		tcu::Vec4( 1,  1,  0,  1),
		tcu::Vec4( 1, -1,  0,  1),
	};

	tcu::TestLog&		log				= m_testCtx.getLog();
	tcu::Surface		testImage		(m_targetSize, m_targetSize);
	tcu::Surface		referenceImage	(m_targetSize, m_targetSize);

	// render test image
	{
		const glw::Functions&		gl			= m_context.getRenderContext().getFunctions();
		const glu::ShaderProgram	program		(m_context.getRenderContext(), glu::makeVtxFragSources(s_shaderSourceVertex, s_shaderSourceFragment));
		const GLint					positionLoc = gl.getAttribLocation(program.getProgram(), "a_position");
		const GLint					colorLoc	= gl.getAttribLocation(program.getProgram(), "a_color");

		if (!program.isOk())
		{
			log << program;
			TCU_FAIL("Shader compile failed.");
		}

		gl.clearColor				(0, 0, 0, 1);
		gl.clearDepthf				(1.0f);
		gl.clear					(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		gl.viewport					(0, 0, m_targetSize, m_targetSize);
		gl.useProgram				(program.getProgram());
		gl.enable					(GL_DEPTH_TEST);
		gl.depthFunc				(GL_LEQUAL);	// make test pass if polygon offset doesn't do anything. It has its own test case. This test is only for to detect always-on cases.

		log << TestLog::Message << "DepthFunc = GL_LEQUAL" << TestLog::EndMessage;

		gl.enableVertexAttribArray	(positionLoc);
		gl.vertexAttribPointer		(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, triangle);

		//draw back (offset disabled)

		log << TestLog::Message << "Draw bottom-right. Color = White.\tState: PolygonOffset(0, -2), POLYGON_OFFSET_FILL disabled." << TestLog::EndMessage;

		gl.polygonOffset			(0, -2);
		gl.disable					(GL_POLYGON_OFFSET_FILL);
		gl.vertexAttrib4f			(colorLoc, 1.0f, 1.0f, 1.0f, 1.0f);
		gl.drawArrays				(GL_TRIANGLES, 0, 3);

		//draw front

		log << TestLog::Message << "Draw bottom-right. Color = Red.\tState: PolygonOffset(0, -1), POLYGON_OFFSET_FILL enabled." << TestLog::EndMessage;

		gl.polygonOffset			(0, -1);
		gl.enable					(GL_POLYGON_OFFSET_FILL);
		gl.vertexAttrib4f			(colorLoc, 1.0f, 0.0f, 0.0f, 1.0f);
		gl.drawArrays				(GL_TRIANGLES, 0, 3);

		gl.disableVertexAttribArray	(positionLoc);
		gl.useProgram				(0);
		gl.finish					();

		glu::readPixels(m_context.getRenderContext(), 0, 0, testImage.getAccess());
	}

	// render reference image
	{
		rr::Renderer		referenceRenderer;
		rr::VertexAttrib	attribs[2];
		rr::RenderState		state((rr::ViewportState)(rr::WindowRectangle(0, 0, m_targetSize, m_targetSize)));

		PositionColorShader program;

		attribs[0].type				= rr::VERTEXATTRIBTYPE_FLOAT;
		attribs[0].size				= 4;
		attribs[0].stride			= 0;
		attribs[0].instanceDivisor	= 0;
		attribs[0].pointer			= triangle;

		attribs[1].type				= rr::VERTEXATTRIBTYPE_DONT_CARE;
		attribs[1].generic			= tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);

		tcu::clear(referenceImage.getAccess(), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

		log << TestLog::Message << "Expecting: Bottom-right = Red." << TestLog::EndMessage;

		referenceRenderer.draw(
			rr::DrawCommand(
				state,
				rr::RenderTarget(rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(referenceImage.getAccess())),
				rr::Program(program.getVertexShader(), program.getFragmentShader()),
				2,
				attribs,
				rr::PrimitiveList(rr::PRIMITIVETYPE_TRIANGLES, 3, 0)));
	}

	// compare
	verifyImages(log, m_testCtx, m_context.getRenderContext(), testImage.getAccess(), referenceImage.getAccess());
}